

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op.c
# Opt level: O1

void tcg_gen_andi_i32_mips(TCGContext_conflict3 *tcg_ctx,TCGv_i32 ret,TCGv_i32 arg1,int32_t arg2)

{
  uintptr_t o_9;
  TCGOp *pTVar1;
  TCGv_i32 pTVar2;
  uintptr_t o;
  TCGOpcode opc;
  uintptr_t o_2;
  
  if (arg2 < 0xff) {
    if (arg2 != -1) {
      if (arg2 == 0) {
        pTVar1 = tcg_emit_op_mips(tcg_ctx,INDEX_op_movi_i32);
        pTVar1->args[0] = (TCGArg)(ret + (long)tcg_ctx);
        pTVar1->args[1] = 0;
        return;
      }
LAB_00730b62:
      pTVar2 = tcg_const_i32_mips(tcg_ctx,arg2);
      pTVar1 = tcg_emit_op_mips(tcg_ctx,INDEX_op_and_i32);
      pTVar1->args[0] = (TCGArg)(ret + (long)tcg_ctx);
      pTVar1->args[1] = (TCGArg)(arg1 + (long)tcg_ctx);
      pTVar1->args[2] = (TCGArg)(pTVar2 + (long)tcg_ctx);
      tcg_temp_free_internal_mips(tcg_ctx,(TCGTemp *)(pTVar2 + (long)tcg_ctx));
      return;
    }
    if (ret == arg1) {
      return;
    }
    opc = INDEX_op_mov_i32;
  }
  else if (arg2 == 0xff) {
    opc = INDEX_op_ext8u_i32;
  }
  else {
    if (arg2 != 0xffff) goto LAB_00730b62;
    opc = INDEX_op_ext16u_i32;
  }
  pTVar1 = tcg_emit_op_mips(tcg_ctx,opc);
  pTVar1->args[0] = (TCGArg)(ret + (long)tcg_ctx);
  pTVar1->args[1] = (TCGArg)(arg1 + (long)tcg_ctx);
  return;
}

Assistant:

void tcg_gen_andi_i32(TCGContext *tcg_ctx, TCGv_i32 ret, TCGv_i32 arg1, int32_t arg2)
{
    TCGv_i32 t0;
    /* Some cases can be optimized here.  */
    switch (arg2) {
    case 0:
        tcg_gen_movi_i32(tcg_ctx, ret, 0);
        return;
    case -1:
        tcg_gen_mov_i32(tcg_ctx, ret, arg1);
        return;
    case 0xff:
        /* Don't recurse with tcg_gen_ext8u_i32.  */
        if (TCG_TARGET_HAS_ext8u_i32) {
            tcg_gen_op2_i32(tcg_ctx, INDEX_op_ext8u_i32, ret, arg1);
            return;
        }
        break;
    case 0xffff:
        if (TCG_TARGET_HAS_ext16u_i32) {
            tcg_gen_op2_i32(tcg_ctx, INDEX_op_ext16u_i32, ret, arg1);
            return;
        }
        break;
    }
    t0 = tcg_const_i32(tcg_ctx, arg2);
    tcg_gen_and_i32(tcg_ctx, ret, arg1, t0);
    tcg_temp_free_i32(tcg_ctx, t0);
}